

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleMumpsCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  string local_268;
  string coverageFile;
  cmParseCacheCoverage ccov;
  ostringstream cmCTestLog_msg;
  cmParseGTMCoverage cov;
  
  cmParseGTMCoverage::cmParseGTMCoverage(&cov,cont,(this->super_cmCTestGenericHandler).CTest);
  cmCTest::GetBinaryDir_abi_cxx11_
            ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&coverageFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg,"/gtm_coverage.mcov");
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  bVar2 = cmsys::SystemTools::FileExists(coverageFile._M_dataplus._M_p);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Parsing Cache Coverage: ");
    poVar3 = std::operator<<(poVar3,(string *)&coverageFile);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x365,(char *)ccov.super_cmParseMumpsCoverage._vptr_cmParseMumpsCoverage,
                 (this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&ccov);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmParseMumpsCoverage::ReadCoverageFile
              (&cov.super_cmParseMumpsCoverage,coverageFile._M_dataplus._M_p);
    iVar4 = (int)(cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Cannot find GTM coverage file: ");
    poVar3 = std::operator<<(poVar3,(string *)&coverageFile);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x36d,(char *)ccov.super_cmParseMumpsCoverage._vptr_cmParseMumpsCoverage,
                 (this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&ccov);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmParseCacheCoverage::cmParseCacheCoverage(&ccov,cont,(this->super_cmCTestGenericHandler).CTest)
    ;
    cmCTest::GetBinaryDir_abi_cxx11_(&local_268,(this->super_cmCTestGenericHandler).CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&local_268,"/cache_coverage.cmcov");
    std::__cxx11::string::operator=((string *)&coverageFile,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&local_268);
    bVar2 = cmsys::SystemTools::FileExists(coverageFile._M_dataplus._M_p);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Parsing Cache Coverage: ");
      poVar3 = std::operator<<(poVar3,(string *)&coverageFile);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x376,local_268._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      cmParseMumpsCoverage::ReadCoverageFile
                (&ccov.super_cmParseMumpsCoverage,coverageFile._M_dataplus._M_p);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Cannot find Cache coverage file: ");
      poVar3 = std::operator<<(poVar3,(string *)&coverageFile);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x37d,local_268._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    iVar4 = (int)(cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    cmParseMumpsCoverage::~cmParseMumpsCoverage(&ccov.super_cmParseMumpsCoverage);
  }
  std::__cxx11::string::~string((string *)&coverageFile);
  cmParseMumpsCoverage::~cmParseMumpsCoverage(&cov.super_cmParseMumpsCoverage);
  return iVar4;
}

Assistant:

int cmCTestCoverageHandler::HandleMumpsCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  // try gtm coverage
  cmParseGTMCoverage cov(*cont, this->CTest);
  std::string coverageFile = this->CTest->GetBinaryDir() +
    "/gtm_coverage.mcov";
  if(cmSystemTools::FileExists(coverageFile.c_str()))
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Parsing Cache Coverage: " << coverageFile
               << std::endl, this->Quiet);
    cov.ReadCoverageFile(coverageFile.c_str());
    return static_cast<int>(cont->TotalCoverage.size());
    }
  else
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Cannot find GTM coverage file: " << coverageFile
               << std::endl, this->Quiet);
    }
  cmParseCacheCoverage ccov(*cont, this->CTest);
  coverageFile = this->CTest->GetBinaryDir() +
    "/cache_coverage.cmcov";
  if(cmSystemTools::FileExists(coverageFile.c_str()))
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Parsing Cache Coverage: " << coverageFile
               << std::endl, this->Quiet);
    ccov.ReadCoverageFile(coverageFile.c_str());
    }
  else
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Cannot find Cache coverage file: " << coverageFile
               << std::endl, this->Quiet);
    }
  return static_cast<int>(cont->TotalCoverage.size());
}